

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_deserialize_set_element
          (t_javame_generator *this,ostream *out,t_set *tset,string *prefix)

{
  t_type *ptVar1;
  ostream *poVar2;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  t_field felem;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string elem;
  string *prefix_local;
  t_set *tset_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  elem.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_elem",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ptVar1 = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_150,(string *)local_48);
  t_field::t_field((t_field *)local_130,ptVar1,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar2 = t_generator::indent((t_generator *)this,out);
  declare_field_abi_cxx11_(&local_170,this,(t_field *)local_130,false);
  poVar2 = std::operator<<(poVar2,(string *)&local_170);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"",&local_191);
  generate_deserialize_field(this,out,(t_field *)local_130,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,".put(");
  ptVar1 = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_1d8,(string *)local_48);
  box_type(&local_1b8,this,ptVar1,&local_1d8);
  poVar2 = std::operator<<(poVar2,(string *)&local_1b8);
  poVar2 = std::operator<<(poVar2,", ");
  ptVar1 = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_218,(string *)local_48);
  box_type(&local_1f8,this,ptVar1,&local_218);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  t_field::~t_field((t_field *)local_130);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_javame_generator::generate_deserialize_set_element(ostream& out,
                                                          t_set* tset,
                                                          string prefix) {
  string elem = tmp("_elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << declare_field(&felem) << endl;

  generate_deserialize_field(out, &felem);

  indent(out) << prefix << ".put(" << box_type(tset->get_elem_type(), elem) << ", "
              << box_type(tset->get_elem_type(), elem) << ");" << endl;
}